

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PrintHeader(Hunk *this,ostream *ss)

{
  ostream *poVar1;
  ostream *in_RSI;
  ulong *in_RDI;
  
  std::operator<<(in_RSI,"@@ ");
  if (in_RDI[3] != 0) {
    poVar1 = std::operator<<(in_RSI,"-");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDI);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,in_RDI[3] + in_RDI[4]);
  }
  if ((in_RDI[3] != 0) && (in_RDI[2] != 0)) {
    std::operator<<(in_RSI," ");
  }
  if (in_RDI[2] != 0) {
    poVar1 = std::operator<<(in_RSI,"+");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[1]);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,in_RDI[2] + in_RDI[4]);
  }
  std::operator<<(in_RSI," @@\n");
  return;
}

Assistant:

void PrintHeader(std::ostream* ss) const {
    *ss << "@@ ";
    if (removes_) {
      *ss << "-" << left_start_ << "," << (removes_ + common_);
    }
    if (removes_ && adds_) {
      *ss << " ";
    }
    if (adds_) {
      *ss << "+" << right_start_ << "," << (adds_ + common_);
    }
    *ss << " @@\n";
  }